

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_types.c
# Opt level: O2

commitments_t * allocateCommitments(picnic_instance_t *params,size_t numCommitments)

{
  byte bVar1;
  ushort uVar2;
  commitments_t *pcVar3;
  uint8_t **ppuVar4;
  uint32_t i;
  ulong uVar5;
  uint8_t **ppuVar6;
  uint uVar7;
  
  uVar2 = params->num_rounds;
  pcVar3 = (commitments_t *)malloc((ulong)uVar2 << 4);
  if (numCommitments == 0) {
    numCommitments = (size_t)params->num_MPC_parties;
  }
  pcVar3->nCommitments = numCommitments;
  bVar1 = params->digest_size;
  ppuVar4 = (uint8_t **)malloc(numCommitments * uVar2 * ((ulong)bVar1 + 8));
  for (uVar5 = 0; uVar5 != uVar2; uVar5 = uVar5 + 1) {
    pcVar3[uVar5].hashes = ppuVar4;
    ppuVar6 = ppuVar4 + numCommitments;
    for (uVar7 = 0; uVar7 < numCommitments; uVar7 = uVar7 + 1) {
      ppuVar4[uVar7] = (uint8_t *)ppuVar6;
      ppuVar6 = (uint8_t **)((long)ppuVar6 + (ulong)bVar1);
    }
    ppuVar4 = ppuVar6;
  }
  return pcVar3;
}

Assistant:

commitments_t* allocateCommitments(const picnic_instance_t* params, size_t numCommitments) {
  commitments_t* commitments = malloc(params->num_rounds * sizeof(commitments_t));

  commitments->nCommitments = numCommitments ? numCommitments : params->num_MPC_parties;

  uint8_t* slab = malloc(params->num_rounds * (commitments->nCommitments * params->digest_size +
                                               commitments->nCommitments * sizeof(uint8_t*)));

  for (uint32_t i = 0; i < params->num_rounds; i++) {
    commitments[i].hashes = (uint8_t**)slab;
    slab += commitments->nCommitments * sizeof(uint8_t*);

    for (uint32_t j = 0; j < commitments->nCommitments; j++) {
      commitments[i].hashes[j] = slab;
      slab += params->digest_size;
    }
  }

  return commitments;
}